

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::protos::gen::ChromeCompositorStateMachine_MajorState::
~ChromeCompositorStateMachine_MajorState(ChromeCompositorStateMachine_MajorState *this)

{
  ~ChromeCompositorStateMachine_MajorState(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

ChromeCompositorStateMachine_MajorState::~ChromeCompositorStateMachine_MajorState() = default;